

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.c
# Opt level: O1

size_t FSE_buildDTable_raw(FSE_DTable *dt,uint nbBits)

{
  uint uVar1;
  ulong uVar2;
  
  if (nbBits != 0) {
    *(short *)dt = (short)nbBits;
    *(undefined2 *)((long)dt + 2) = 1;
    uVar1 = 0;
    do {
      uVar2 = (ulong)uVar1;
      *(undefined2 *)(dt + uVar2 + 1) = 0;
      *(char *)((long)dt + uVar2 * 4 + 6) = (char)uVar1;
      *(byte *)((long)dt + uVar2 * 4 + 7) = (byte)nbBits;
      uVar1 = uVar1 + 1;
    } while (uVar1 >> ((byte)nbBits & 0x1f) == 0);
    return 0;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t FSE_buildDTable_raw (FSE_DTable* dt, unsigned nbBits)
{
    void* ptr = dt;
    FSE_DTableHeader* const DTableH = (FSE_DTableHeader*)ptr;
    void* dPtr = dt + 1;
    FSE_decode_t* const dinfo = (FSE_decode_t*)dPtr;
    const unsigned tableSize = 1 << nbBits;
    const unsigned tableMask = tableSize - 1;
    const unsigned maxSV1 = tableMask+1;
    unsigned s;

    /* Sanity checks */
    if (nbBits < 1) return ERROR(GENERIC);         /* min size */

    /* Build Decoding Table */
    DTableH->tableLog = (U16)nbBits;
    DTableH->fastMode = 1;
    for (s=0; s<maxSV1; s++) {
        dinfo[s].newState = 0;
        dinfo[s].symbol = (BYTE)s;
        dinfo[s].nbBits = (BYTE)nbBits;
    }

    return 0;
}